

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

string * ctemplate::PrettyPrintModifiers
                   (string *__return_storage_ptr__,
                   vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                   *modvals,string *separator)

{
  string *extraout_RDX;
  string *extraout_RDX_00;
  pointer ppMVar1;
  string sStack_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (ppMVar1 = (modvals->
                 super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppMVar1 !=
      (modvals->
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      )._M_impl.super__Vector_impl_data._M_finish; ppMVar1 = ppMVar1 + 1) {
    if (ppMVar1 !=
        (modvals->
        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      separator = extraout_RDX;
    }
    PrettyPrintOneModifier_abi_cxx11_
              (&sStack_48,(ctemplate *)*ppMVar1,(ModifierAndValue *)separator);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    separator = extraout_RDX_00;
  }
  return __return_storage_ptr__;
}

Assistant:

string PrettyPrintModifiers(const vector<const ModifierAndValue*>& modvals,
                            const string& separator) {
  string out;
  for (vector<const ModifierAndValue*>::const_iterator it =
           modvals.begin(); it != modvals.end();  ++it) {
    if (it != modvals.begin())
      out.append(separator);
    out.append(PrettyPrintOneModifier(**it));
  }
  return out;
}